

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_foreach::dump(statement_foreach *this,ostream *o)

{
  _Elt_pointer ppsVar1;
  ostream *poVar2;
  _Map_pointer pppsVar3;
  _Elt_pointer ppsVar4;
  statement_base **ptr;
  _Elt_pointer ppsVar5;
  
  std::operator<<(o,"< BeginForEach >\n");
  poVar2 = std::operator<<(o,"< IteratorID = \"");
  poVar2 = std::operator<<(poVar2,(string *)&this->mIt);
  std::operator<<(poVar2,"\", TargetValue = ");
  compiler_type::dump_expr((this->mObj).mRoot,o);
  std::operator<<(o," >\n< Body >\n");
  ppsVar5 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar4 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pppsVar3 = (this->mBlock).
             super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  ppsVar1 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  while (ppsVar5 != ppsVar1) {
    (*(*ppsVar5)->_vptr_statement_base[5])(*ppsVar5,o);
    ppsVar5 = ppsVar5 + 1;
    if (ppsVar5 == ppsVar4) {
      ppsVar5 = pppsVar3[1];
      pppsVar3 = pppsVar3 + 1;
      ppsVar4 = ppsVar5 + 0x40;
    }
  }
  std::operator<<(o,"< EndForEach >\n");
  return;
}

Assistant:

void statement_foreach::dump(std::ostream &o) const
	{
		o << "< BeginForEach >\n";
		o << "< IteratorID = \"" << mIt << "\", TargetValue = ";
		compiler_type::dump_expr(mObj.root(), o);
		o << " >\n< Body >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< EndForEach >\n";
	}